

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_gradation_at_complexity
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL gradation,REF_DBL complexity)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  uint uVar4;
  undefined8 uVar5;
  REF_DBL *pRVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  REF_DBL RVar11;
  REF_DBL current_complexity;
  uint local_94;
  double local_88;
  int local_7c;
  REF_DBL local_78;
  double local_70;
  REF_DBL local_68;
  REF_DBL *local_50;
  double local_48;
  
  pRVar2 = ref_grid->node;
  local_70 = *(double *)(&DAT_00237cd0 + (ulong)(ref_grid->twod == 0) * 8);
  local_48 = complexity;
  if (complexity <= -complexity) {
    local_48 = -complexity;
  }
  local_50 = metric + 5;
  iVar7 = 0;
  local_78 = gradation;
  local_68 = complexity;
  do {
    uVar4 = ref_metric_complexity(metric,ref_grid,&local_88);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x43b,"ref_metric_gradation_at_complexity",(ulong)uVar4,"cmp");
      return uVar4;
    }
    dVar10 = local_88 * 1e+20;
    if (dVar10 <= -dVar10) {
      dVar10 = -dVar10;
    }
    if (dVar10 <= local_48) {
      if (ref_grid->mpi->id != 0) {
        return 4;
      }
      printf("div zero target %.18e current %.18e\n",local_68);
      return 4;
    }
    RVar11 = local_78;
    local_7c = iVar7;
    if (0 < pRVar2->max) {
      lVar9 = 0;
      pRVar6 = metric;
      do {
        if (-1 < pRVar2->global[lVar9]) {
          lVar8 = 0;
          do {
            dVar10 = pow(local_68 / local_88,local_70);
            pRVar6[lVar8] = dVar10 * pRVar6[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 6);
          RVar11 = local_78;
          if (ref_grid->twod != 0) {
            metric[lVar9 * 6 + 2] = 0.0;
            metric[lVar9 * 6 + 4] = 0.0;
            metric[lVar9 * 6 + 5] = 1.0;
          }
        }
        lVar9 = lVar9 + 1;
        pRVar6 = pRVar6 + 6;
      } while (lVar9 < pRVar2->max);
    }
    if (1.0 <= RVar11) {
      uVar4 = ref_metric_metric_space_gradation(metric,ref_grid,RVar11);
      iVar7 = local_7c;
      if (uVar4 != 0) {
        uVar5 = 0x452;
        goto LAB_001cfa76;
      }
    }
    else {
      uVar4 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
      iVar7 = local_7c;
      if (uVar4 != 0) {
        uVar5 = 0x44f;
LAB_001cfa76:
        iVar7 = local_7c;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar5,"ref_metric_gradation_at_complexity",(ulong)uVar4,"gradation");
        local_94 = uVar4;
      }
    }
    if (uVar4 != 0) {
      return local_94;
    }
    if ((ref_grid->twod != 0) && (iVar1 = pRVar2->max, 0 < (long)iVar1)) {
      pRVar3 = pRVar2->global;
      lVar9 = 0;
      pRVar6 = local_50;
      do {
        if (-1 < pRVar3[lVar9]) {
          pRVar6[-3] = 0.0;
          pRVar6[-1] = 0.0;
          *pRVar6 = 1.0;
        }
        lVar9 = lVar9 + 1;
        pRVar6 = pRVar6 + 6;
      } while (iVar1 != lVar9);
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == 0x14) {
      local_94 = ref_metric_complexity(metric,ref_grid,&local_88);
      if (local_94 == 0) {
        dVar10 = local_88 * 1e+20;
        if (dVar10 <= -dVar10) {
          dVar10 = -dVar10;
        }
        RVar11 = local_68;
        if (local_68 <= -local_68) {
          RVar11 = -local_68;
        }
        local_94 = 4;
        if (RVar11 < dVar10) {
          if (pRVar2->max < 1) {
            local_94 = 0;
          }
          else {
            lVar9 = 0;
            pRVar6 = metric;
            do {
              if (-1 < pRVar2->global[lVar9]) {
                lVar8 = 0;
                do {
                  dVar10 = pow(local_68 / local_88,local_70);
                  pRVar6[lVar8] = dVar10 * pRVar6[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 6);
                if (ref_grid->twod != 0) {
                  metric[lVar9 * 6 + 2] = 0.0;
                  metric[lVar9 * 6 + 4] = 0.0;
                  metric[lVar9 * 6 + 5] = 1.0;
                }
              }
              lVar9 = lVar9 + 1;
              pRVar6 = pRVar6 + 6;
              local_94 = 0;
            } while (lVar9 < pRVar2->max);
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x45c,"ref_metric_gradation_at_complexity",(ulong)local_94,"cmp");
      }
      return local_94;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_gradation_at_complexity(REF_DBL *metric,
                                                      REF_GRID ref_grid,
                                                      REF_DBL gradation,
                                                      REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT relaxations;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;
  REF_INT node, i;

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  for (relaxations = 0; relaxations < 20; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(complexity, current_complexity)) {
      if (ref_mpi_once(ref_grid_mpi(ref_grid)))
        printf("div zero target %.18e current %.18e\n", complexity,
               current_complexity);
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] *=
            pow(complexity / current_complexity, complexity_scale);
      }
      if (ref_grid_twod(ref_grid)) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
    if (gradation < 1.0) {
      RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0),
          "gradation");
    } else {
      RSS(ref_metric_metric_space_gradation(metric, ref_grid, gradation),
          "gradation");
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
  }
  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}